

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::CopyJsonNameTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  string_view value;
  uint32_t *puVar1;
  Arena *arena;
  string_view local_50;
  FieldDescriptorProto *local_40;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *this_local;
  char *local_28;
  string_view *local_20;
  FieldDescriptorProto *local_18;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_10;
  
  local_40 = proto;
  proto_local = (FieldDescriptorProto *)this;
  local_50 = json_name(this);
  local_20 = &local_50;
  local_10 = &proto->field_0;
  local_18 = proto;
  puVar1 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 0x10;
  this_local = (FieldDescriptor *)local_20->_M_len;
  local_28 = local_20->_M_str;
  arena = MessageLite::GetArena((MessageLite *)proto);
  value._M_str = local_28;
  value._M_len = (size_t)this_local;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.json_name_,value,arena);
  return;
}

Assistant:

void FieldDescriptor::CopyJsonNameTo(FieldDescriptorProto* proto) const {
  proto->set_json_name(json_name());
}